

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSignal.h
# Opt level: O2

CollectorResult __thiscall
Simple::Lib::
ProtoSignal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int),_Simple::Lib::CollectorDefault<void>_>
::emit(ProtoSignal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int),_Simple::Lib::CollectorDefault<void>_>
       *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,int args_1)

{
  bool bVar1;
  SignalLink *this_00;
  SignalLink *this_01;
  CollectorDefault<void> collector;
  CollectorDefault<void> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = this->callback_ring_;
  if (this_00 != (SignalLink *)0x0) {
    SignalLink::incref(this_00);
    do {
      if ((this_00->function).super__Function_base._M_manager != (_Manager_type)0x0) {
        std::__cxx11::string::string((string *)&local_50,(string *)args);
        bVar1 = CollectorInvocation<Simple::Lib::CollectorDefault<void>,_void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int)>
                ::invoke((CollectorInvocation<Simple::Lib::CollectorDefault<void>,_void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int)>
                          *)this,&local_51,&this_00->function,&local_50,args_1);
        std::__cxx11::string::~string((string *)&local_50);
        this_01 = this_00;
        if (!bVar1) break;
      }
      this_01 = this_00->next;
      SignalLink::incref(this_01);
      SignalLink::decref(this_00);
      this_00 = this_01;
    } while (this_01 != this->callback_ring_);
    SignalLink::decref(this_01);
  }
  return;
}

Assistant:

CollectorResult
  emit (Args... args)
  {
    Collector collector;
    if (!callback_ring_)
      return collector.result();
    SignalLink *link = callback_ring_;
    link->incref();
    do
      {
        if (link->function != nullptr)
          {
            const bool continue_emission = this->invoke (collector, link->function, args...);
            if (!continue_emission)
              break;
          }
        SignalLink *old = link;
        link = old->next;
        link->incref();
        old->decref();
      }
    while (link != callback_ring_);
    link->decref();
    return collector.result();
  }